

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  const_iterator cVar5;
  char *pcVar6;
  _Rb_tree_node_base *p_Var7;
  undefined8 extraout_RAX;
  size_t sVar8;
  ostream *poVar9;
  char *pcVar10;
  Message MVar11;
  Message errors;
  String name;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  Message local_a8;
  String local_a0;
  uint local_8c;
  _Rb_tree_node_base *local_88;
  TypedTestCasePState *local_80;
  char local_78 [16];
  char *local_68;
  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  local_60;
  
  *this = (TypedTestCasePState)0x1;
  pcVar10 = registered_tests + -1;
  local_8c = line;
  local_80 = this;
  local_68 = file;
  do {
    pcVar6 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
    iVar3 = isspace((int)*pcVar6);
  } while (iVar3 != 0);
  Message::Message(&local_a8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = (_Rb_tree_node_base *)(local_80 + 0x10);
  pcVar6 = pcVar10;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar4 = strchr(pcVar6,0x2c);
    if (pcVar4 == (char *)0x0) {
      String::String(&local_a0,pcVar6);
    }
    else {
      sVar8 = (long)pcVar4 - (long)pcVar6;
      pcVar4 = (char *)operator_new__(sVar8 + 1);
      memcpy(pcVar4,pcVar6,sVar8);
      pcVar4[sVar8] = '\0';
      local_a0.c_str_ = pcVar4;
      local_a0.length_ = sVar8;
    }
    cVar5 = std::
            _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::find(&local_60,&local_a0);
    p_Var1 = local_88;
    if ((_Rb_tree_header *)cVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
      for (p_Var7 = *(_Rb_tree_node_base **)(local_80 + 0x20); p_Var7 != p_Var1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        bVar2 = String::operator==(&local_a0,*(char **)(p_Var7 + 1));
        if (bVar2) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)&local_60,&local_a0);
          goto LAB_0015be1e;
        }
      }
      poVar9 = (ostream *)local_a8.ss_ + 0x10;
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"No test named ",0xe);
      pcVar4 = local_a0.c_str_;
      poVar9 = (ostream *)(local_a8.ss_ + 0x10);
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      if (local_a0.c_str_ == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
      }
      else if (local_a0.length_ != 0) {
        sVar8 = 0;
        do {
          if (pcVar4[sVar8] == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
          }
          else {
            local_78[0] = pcVar4[sVar8];
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_78,1);
          }
          sVar8 = sVar8 + 1;
        } while (sVar8 != local_a0.length_);
      }
      poVar9 = (ostream *)(local_a8.ss_ + 0x10);
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," can be found in this test case.\n",0x21);
    }
    else {
      poVar9 = (ostream *)(local_a8.ss_ + 0x10);
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Test ",5);
      pcVar4 = local_a0.c_str_;
      poVar9 = (ostream *)(local_a8.ss_ + 0x10);
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      if (local_a0.c_str_ == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
      }
      else if (local_a0.length_ != 0) {
        sVar8 = 0;
        do {
          if (pcVar4[sVar8] == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
          }
          else {
            local_78[0] = pcVar4[sVar8];
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_78,1);
          }
          sVar8 = sVar8 + 1;
        } while (sVar8 != local_a0.length_);
      }
      poVar9 = (ostream *)(local_a8.ss_ + 0x10);
      if (local_a8.ss_ == (StrStream *)0x0) {
        poVar9 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," is listed more than once.\n",0x1b)
      ;
    }
LAB_0015be1e:
    if (local_a0.c_str_ != (char *)0x0) {
      operator_delete__(local_a0.c_str_);
    }
    pcVar6 = strchr(pcVar6,0x2c);
    p_Var1 = local_88;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      do {
        pcVar4 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
        iVar3 = isspace((int)*pcVar4);
      } while (iVar3 != 0);
    }
    if (pcVar6 == (char *)0x0) {
      p_Var7 = *(_Rb_tree_node_base **)(local_80 + 0x20);
      if (p_Var7 != p_Var1) {
        do {
          String::String(&local_a0,*(char **)(p_Var7 + 1));
          cVar5 = std::
                  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                  ::find(&local_60,&local_a0);
          if (local_a0.c_str_ != (char *)0x0) {
            operator_delete__(local_a0.c_str_);
          }
          if ((_Rb_tree_header *)cVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
            poVar9 = (ostream *)(local_a8.ss_ + 0x10);
            if (local_a8.ss_ == (StrStream *)0x0) {
              poVar9 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"You forgot to list test ",0x18);
            pcVar6 = *(char **)(p_Var7 + 1);
            if (pcVar6 == (char *)0x0) {
              MVar11.ss_ = local_a8.ss_ + 0x10;
              sVar8 = 6;
              pcVar6 = "(null)";
            }
            else {
              MVar11.ss_ = local_a8.ss_;
              if (local_a8.ss_ != (StrStream *)0x0) {
                MVar11.ss_ = (StrStream *)(local_a8.ss_ + 0x10);
              }
              sVar8 = strlen(pcVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar11.ss_,pcVar6,sVar8);
            poVar9 = (ostream *)(local_a8.ss_ + 0x10);
            if (local_a8.ss_ == (StrStream *)0x0) {
              poVar9 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != local_88);
      }
      StrStreamToString((internal *)&local_a0,local_a8.ss_);
      bVar2 = String::operator==(&local_a0,"");
      if (bVar2) {
        if (local_a0.c_str_ != (char *)0x0) {
          operator_delete__(local_a0.c_str_);
        }
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree(&local_60);
        if (local_a8.ss_ != (StrStream *)0x0) {
          (**(code **)(*(long *)local_a8.ss_ + 8))();
        }
        return pcVar10;
      }
      pcVar10 = "unknown file";
      if (local_68 != (char *)0x0) {
        pcVar10 = local_68;
      }
      if ((int)local_8c < 0) {
        String::Format(local_78,"%s:",pcVar10);
      }
      else {
        String::Format(local_78,"%s:%d:",pcVar10,(ulong)local_8c);
      }
      VerifyRegisteredTestNames();
      if (local_a0.c_str_ != (char *)0x0) {
        operator_delete__(local_a0.c_str_);
      }
      std::
      _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
      ::~_Rb_tree(&local_60);
      if (local_a8.ss_ != (StrStream *)0x0) {
        (**(code **)(*(long *)local_a8.ss_ + 8))();
      }
      _Unwind_Resume(extraout_RAX);
    }
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}